

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int lws_confirm_host_header(lws *wsi)

{
  int iVar1;
  lws_tokenize_elem lVar2;
  char local_d8 [8];
  char buf [128];
  uint local_48;
  int n;
  int port;
  lws_tokenize_elem e;
  lws_tokenize ts;
  lws *wsi_local;
  
  local_48 = 0x50;
  ts._32_8_ = wsi;
  iVar1 = lws_hdr_total_length(wsi,WSI_TOKEN_HOST);
  if (iVar1 == 0) {
    _lws_log(8,"%s: missing host on upgrade\n","lws_confirm_host_header");
    return 1;
  }
  if (*(long *)(ts._32_8_ + 0x290) != 0) {
    local_48 = 0x1bb;
  }
  lws_tokenize_init((lws_tokenize *)&port,local_d8,0x31);
  iVar1 = lws_hdr_copy((lws *)ts._32_8_,local_d8,0x7f,WSI_TOKEN_HOST);
  if (iVar1 < 1) {
    _lws_log(8,"%s: missing or oversize host header\n","lws_confirm_host_header");
    return 1;
  }
  ts.token = (char *)(long)iVar1;
  lVar2 = lws_tokenize((lws_tokenize *)&port);
  if (lVar2 == LWS_TOKZE_TOKEN) {
    iVar1 = strncmp(ts.start,*(char **)(*(long *)(ts._32_8_ + 0x200) + 0x168),ts.len);
    if (iVar1 != 0) {
      ts.start[ts.len] = '\0';
      _lws_log(8,"%s: \'%s\' in host hdr but vhost name %s\n","lws_confirm_host_header",ts.start,
               *(undefined8 *)(*(long *)(ts._32_8_ + 0x200) + 0x168));
      return 1;
    }
    lVar2 = lws_tokenize((lws_tokenize *)&port);
    if ((lVar2 == LWS_TOKZE_DELIMITER) && (*ts.start == ':')) {
      lVar2 = lws_tokenize((lws_tokenize *)&port);
      if (lVar2 == LWS_TOKZE_INTEGER) {
        local_48 = atoi(ts.start);
LAB_00150330:
        if (*(uint *)(*(long *)(ts._32_8_ + 0x200) + 0x290) != local_48) {
          _lws_log(8,"%s: host port %d mismatches vhost port %d\n","lws_confirm_host_header",
                   (ulong)local_48,(ulong)*(uint *)(*(long *)(ts._32_8_ + 0x200) + 0x290));
          return 1;
        }
        _lws_log(0x10,"%s: host header OK\n","lws_confirm_host_header");
        return 0;
      }
    }
    else if (lVar2 == LWS_TOKZE_ENDED) goto LAB_00150330;
  }
  _lws_log(8,"%s: bad host header format\n","lws_confirm_host_header");
  return 1;
}

Assistant:

int
lws_confirm_host_header(struct lws *wsi)
{
	struct lws_tokenize ts;
	lws_tokenize_elem e;
	int port = 80, n;
	char buf[128];

	/*
	 * this vhost wants us to validate what the
	 * client sent against our vhost name
	 */

	if (!lws_hdr_total_length(wsi, WSI_TOKEN_HOST)) {
		lwsl_info("%s: missing host on upgrade\n", __func__);

		return 1;
	}

#if defined(LWS_WITH_TLS)
	if (wsi->tls.ssl)
		port = 443;
#endif

	lws_tokenize_init(&ts, buf, LWS_TOKENIZE_F_DOT_NONTERM /* server.com */|
				    LWS_TOKENIZE_F_NO_FLOATS /* 1.server.com */|
				    LWS_TOKENIZE_F_MINUS_NONTERM /* a-b.com */);
	n = lws_hdr_copy(wsi, buf, sizeof(buf) - 1, WSI_TOKEN_HOST);
	if (n <= 0) {
		lwsl_info("%s: missing or oversize host header\n", __func__);
		return 1;
	}
	ts.len = n;

	if (lws_tokenize(&ts) != LWS_TOKZE_TOKEN)
		goto bad_format;

	if (strncmp(ts.token, wsi->vhost->name, ts.token_len)) {
		buf[(ts.token - buf) + ts.token_len] = '\0';
		lwsl_info("%s: '%s' in host hdr but vhost name %s\n",
			  __func__, ts.token, wsi->vhost->name);
		return 1;
	}

	e = lws_tokenize(&ts);
	if (e == LWS_TOKZE_DELIMITER && ts.token[0] == ':') {
		if (lws_tokenize(&ts) != LWS_TOKZE_INTEGER)
			goto bad_format;
		else
			port = atoi(ts.token);
	} else
		if (e != LWS_TOKZE_ENDED)
			goto bad_format;

	if (wsi->vhost->listen_port != port) {
		lwsl_info("%s: host port %d mismatches vhost port %d\n",
			  __func__, port, wsi->vhost->listen_port);
		return 1;
	}

	lwsl_debug("%s: host header OK\n", __func__);

	return 0;

bad_format:
	lwsl_info("%s: bad host header format\n", __func__);

	return 1;
}